

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialog::done(QFileDialog *this,int result)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  char *pcVar4;
  QObject *pQVar5;
  char *pcVar6;
  
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  QDialog::done(&this->super_QDialog,result);
  lVar2 = *(long *)(lVar1 + 0x390);
  if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (*(long *)(lVar1 + 0x398) != 0)) {
    pcVar6 = *(char **)(lVar1 + 0x3c0);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (char *)&QByteArray::_empty;
    }
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      pQVar5 = (QObject *)0x0;
    }
    else {
      pQVar5 = *(QObject **)(lVar1 + 0x398);
    }
    pcVar4 = *(char **)(lVar1 + 0x3a8);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)&QByteArray::_empty;
    }
    QObject::disconnect((QObject *)this,pcVar6,pQVar5,pcVar4);
    piVar3 = *(int **)(lVar1 + 0x390);
    *(undefined8 *)(lVar1 + 0x390) = 0;
    *(undefined8 *)(lVar1 + 0x398) = 0;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        operator_delete(piVar3);
      }
    }
  }
  QByteArray::clear();
  QByteArray::clear();
  return;
}

Assistant:

void QFileDialog::done(int result)
{
    Q_D(QFileDialog);

    QDialog::done(result);

    if (d->receiverToDisconnectOnClose) {
        disconnect(this, d->signalToDisconnectOnClose,
                   d->receiverToDisconnectOnClose, d->memberToDisconnectOnClose);
        d->receiverToDisconnectOnClose = nullptr;
    }
    d->memberToDisconnectOnClose.clear();
    d->signalToDisconnectOnClose.clear();
}